

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

ON_ComponentManifestItem_PRIVATE * __thiscall
ON_ComponentManifestImpl::ChangeItemNameHash
          (ON_ComponentManifestImpl *this,ON_UUID *manifest_item_id,ON_NameHash *new_name_hash)

{
  bool bVar1;
  ON_ComponentManifestHash32TableItem *pOVar2;
  ON_ComponentNameHash32Table *this_00;
  ON_ComponentNameHash32Table *name_hash_table;
  ON_ComponentManifestHash32TableItem *hash_item;
  undefined1 local_58 [7];
  bool bUniqueNameRequired;
  ON_NameHash old_name_hash;
  ON_ComponentManifestItem_PRIVATE *item;
  ON_NameHash *new_name_hash_local;
  ON_UUID *manifest_item_id_local;
  ON_ComponentManifestImpl *this_local;
  
  bVar1 = ON_NameHash::IsInvalidNameHash(new_name_hash);
  if (bVar1) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
               ,0x1003,"","new_name_hash parameter is not valid.");
    this_local = (ON_ComponentManifestImpl *)0x0;
  }
  else {
    old_name_hash.m_parent_id.Data4 = (uchar  [8])ItemFromManifestId(this,manifest_item_id);
    if (old_name_hash.m_parent_id.Data4 == (uchar  [8])0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
                 ,0x100b,"","id not valid.");
      this_local = (ON_ComponentManifestImpl *)0x0;
    }
    else {
      memcpy(local_58,(ON_NameHash *)((long)old_name_hash.m_parent_id.Data4 + 0x28),0x28);
      bVar1 = ::operator==((ON_NameHash *)local_58,new_name_hash);
      if (bVar1) {
        this_local = (ON_ComponentManifestImpl *)old_name_hash.m_parent_id.Data4;
      }
      else {
        bVar1 = ON_ModelComponent::UniqueNameRequired
                          (*(Type *)((long)old_name_hash.m_parent_id.Data4 + 4));
        if (bVar1) {
          bVar1 = ON_NameHash::IsValidAndNotEmpty(new_name_hash);
          if (!bVar1) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
                       ,0x1019,"","new_name_hash must be valid and not empty.");
            return (ON_ComponentManifestItem_PRIVATE *)0x0;
          }
          pOVar2 = ON_ComponentNameHash32Table::FirstManifestItemWithName
                             (&this->m_unique_name_hash_table,
                              *(Type *)((long)old_name_hash.m_parent_id.Data4 + 4),new_name_hash);
          if (pOVar2 != (ON_ComponentManifestHash32TableItem *)0x0) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
                       ,0x101f,"","new name is in use.");
            return (ON_ComponentManifestItem_PRIVATE *)0x0;
          }
        }
        this_00 = ComponentNameHash32Table
                            (this,*(Type *)((long)old_name_hash.m_parent_id.Data4 + 4));
        bVar1 = ON_NameHash::IsValidAndNotEmpty((ON_NameHash *)local_58);
        if ((bVar1) &&
           (bVar1 = ON_ComponentNameHash32Table::RemoveManifestItem
                              (this_00,(ON_ComponentManifestItem_PRIVATE *)
                                       old_name_hash.m_parent_id.Data4), !bVar1)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
                     ,0x102a,"","old name not in manifest.");
        }
        this->m_manifest_content_version_number = this->m_manifest_content_version_number + 1;
        memcpy((void *)((long)old_name_hash.m_parent_id.Data4 + 0x28),new_name_hash,0x28);
        bVar1 = ON_NameHash::IsValidAndNotEmpty(new_name_hash);
        if (bVar1) {
          ON_ComponentNameHash32Table::AddManifestItem
                    (this_00,(ON_ComponentManifestItem_PRIVATE *)old_name_hash.m_parent_id.Data4);
        }
        this_local = (ON_ComponentManifestImpl *)old_name_hash.m_parent_id.Data4;
      }
    }
  }
  return (ON_ComponentManifestItem_PRIVATE *)this_local;
}

Assistant:

const ON_ComponentManifestItem_PRIVATE* ON_ComponentManifestImpl::ChangeItemNameHash(
  const ON_UUID& manifest_item_id,
  const ON_NameHash& new_name_hash
  )
{
  if (new_name_hash.IsInvalidNameHash())
  {
    ON_ERROR("new_name_hash parameter is not valid.");
    return nullptr;
  }

  ON_ComponentManifestItem_PRIVATE* item = const_cast<ON_ComponentManifestItem_PRIVATE*>(ItemFromManifestId(manifest_item_id));

  if (nullptr == item)
  {
    ON_ERROR("id not valid.");
    return nullptr;
  }

  const ON_NameHash old_name_hash = item->m_name_hash;
  
  if ( old_name_hash == new_name_hash )
    return item;
  
  const bool bUniqueNameRequired = ON_ModelComponent::UniqueNameRequired(item->m_component_type);
  if (bUniqueNameRequired)
  {
    if (false == new_name_hash.IsValidAndNotEmpty())
    {
      ON_ERROR("new_name_hash must be valid and not empty.");
      return nullptr;
    }
    const ON_ComponentManifestHash32TableItem* hash_item = m_unique_name_hash_table.FirstManifestItemWithName(item->m_component_type,new_name_hash);
    if (nullptr != hash_item )
    {
      ON_ERROR("new name is in use.");
      return nullptr;
    }
  }

  ON_ComponentNameHash32Table& name_hash_table = ComponentNameHash32Table(item->m_component_type);

  if (old_name_hash.IsValidAndNotEmpty())
  {
    if (false == name_hash_table.RemoveManifestItem(item))
    {
      ON_ERROR("old name not in manifest.");
    }
  }

  m_manifest_content_version_number++;
  item->m_name_hash = new_name_hash;
  if ( new_name_hash.IsValidAndNotEmpty() )
    name_hash_table.AddManifestItem(item);

  return item;
}